

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmCaseInsensitiveDirectoryListGenerator *gen)

{
  byte bVar1;
  bool bVar2;
  string local_80;
  int local_4c;
  undefined1 local_48 [8];
  string path;
  cmCaseInsensitiveDirectoryListGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = gen;
  ResetGenerator<(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>(gen);
  anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
            ((string *)local_48,(cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_,
             startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_4c = 2;
LAB_005e7d2d:
      std::__cxx11::string::~string((string *)local_48);
      if (local_4c != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    anon_unknown.dwarf_ad0985::ResetGenerator();
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&>
                      (filesCollector,(string *)local_48);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_4c = 1;
      goto LAB_005e7d2d;
    }
    anon_unknown.dwarf_ad0985::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
              (&local_80,(cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_,startPath);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}